

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_multi_noncentral_relative_pose_sac.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  byte bVar1;
  bool bVar2;
  MultiNoncentralRelativePoseSacProblem *this;
  ostream *poVar3;
  long *plVar4;
  pointer piVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [16];
  undefined8 extraout_XMM1_Qb;
  undefined8 uVar19;
  undefined1 auVar18 [16];
  undefined8 in_XMM2_Qa;
  undefined1 auVar20 [64];
  timeval tVar21;
  timeval tVar22;
  shared_ptr<opengv::sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem>
  relposeproblem_ptr;
  rotations_t camRotations;
  translations_t camOffsets;
  timeval tic;
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  multiBearingVectors2;
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  multiBearingVectors1;
  translation_t position1;
  vector<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
  gt;
  timeval toc;
  translation_t position2;
  rotation_t rotation1;
  translation_t position;
  rotation_t rotation2;
  rotation_t rotation;
  NoncentralRelativeMultiAdapter adapter;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_438;
  rotations_t local_430;
  translations_t local_410;
  timeval local_3f0;
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  local_3e0;
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  local_3c0;
  translation_t local_3a0;
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  local_380;
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  local_368;
  vector<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
  local_350;
  timeval local_330;
  Vector3d local_320;
  rotation_t local_308;
  undefined1 local_2c0 [128];
  pointer local_240;
  pointer pvStack_238;
  pointer pvStack_230;
  pointer pvStack_228;
  pointer pvStack_220;
  pointer pvStack_218;
  element_type *peStack_210;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_208 [3];
  translation_t local_1f0;
  Matrix3d local_1d8;
  rotation_t local_190;
  NoncentralRelativeMultiAdapter local_148;
  
  opengv::initializeRandomSeed();
  local_3a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       0.0;
  local_3a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       0.0;
  local_3a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       0.0;
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       1.0;
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       0.0;
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       0.0;
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       1.0;
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       0.0;
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       0.0;
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       0.0;
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       1.0;
  opengv::generateRandomTranslation(&local_320,2.0);
  opengv::generateRandomRotation(&local_1d8,0.5);
  local_410.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_410.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_410.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_430.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_430.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_430.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  opengv::generateRandomCameraSystem(4,&local_410,&local_430);
  local_3c0.
  super__Vector_base<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3c0.
  super__Vector_base<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3c0.
  super__Vector_base<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3e0.
  super__Vector_base<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3e0.
  super__Vector_base<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3e0.
  super__Vector_base<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_350.
  super__Vector_base<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_350.
  super__Vector_base<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_350.
  super__Vector_base<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  opengv::generateMulti2D2DCorrespondences
            (&local_3a0,&local_308,&local_320,&local_1d8,&local_410,&local_430,0x19,0.3,0.1,
             &local_3c0,&local_3e0,&local_350);
  opengv::extractRelativePose
            (&local_3a0,&local_320,&local_308,&local_1d8,&local_1f0,&local_190,false);
  opengv::printExperimentCharacteristics(&local_1f0,&local_190,0.3,0.1);
  std::
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ::vector(&local_368,&local_3c0);
  std::
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ::vector(&local_380,&local_3e0);
  opengv::relative_pose::NoncentralRelativeMultiAdapter::NoncentralRelativeMultiAdapter
            (&local_148,&local_368,&local_380,&local_410,&local_430);
  std::
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ::~vector(&local_380);
  std::
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ::~vector(&local_368);
  local_2c0._8_4_ = 1000;
  local_2c0._16_8_ = 1.0;
  local_2c0._24_8_ = 0.99;
  local_240 = (pointer)0x0;
  pvStack_238 = (pointer)0x0;
  pvStack_230 = (pointer)0x0;
  pvStack_228 = (pointer)0x0;
  pvStack_220 = (pointer)0x0;
  pvStack_218 = (pointer)0x0;
  peStack_210 = (element_type *)0x0;
  a_Stack_208[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_2c0._0_8_ = &PTR__MultiSampleConsensus_0027d858;
  this = (MultiNoncentralRelativePoseSacProblem *)operator_new(0x13f0);
  opengv::sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem::
  MultiNoncentralRelativePoseSacProblem
            (this,&local_148.super_RelativeMultiAdapterBase,SIXPT,false,true);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<opengv::sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem*>
            (&local_438,this);
  peStack_210 = this;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(a_Stack_208,&local_438);
  local_2c0._16_8_ = 7.812495421699595e-07;
  local_2c0._8_4_ = 100;
  gettimeofday(&local_3f0,(__timezone_ptr_t)0x0);
  opengv::sac::
  MultiRansac<opengv::sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem>::
  computeModel((MultiRansac<opengv::sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem>
                *)local_2c0,0);
  gettimeofday(&local_330,(__timezone_ptr_t)0x0);
  tVar21 = timeval_minus((timeval *)&local_330,(timeval *)&local_3f0);
  tVar22 = timeval_minus((timeval *)&local_330,(timeval *)&local_3f0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"the ransac threshold is: ",0x19);
  poVar3 = std::ostream::_M_insert<double>((double)local_2c0._16_8_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"the ransac results is: ",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  poVar3 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)(local_2c0 + 0x20))
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  plVar4 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Ransac needed ",0xe);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_2c0._12_4_);
  uVar19 = extraout_XMM1_Qb;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," iterations and ",0x10);
  auVar18._0_8_ = (double)tVar21.tv_sec;
  auVar18._8_8_ = uVar19;
  auVar17._0_8_ = (double)tVar22.tv_usec;
  auVar17._8_8_ = in_XMM2_Qa;
  auVar17 = vfmadd132sd_fma(auVar17,auVar18,ZEXT816(0x3eb0c6f7a0b5ed8d));
  poVar3 = std::ostream::_M_insert<double>(auVar17._0_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," seconds",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  plVar4 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  if ((long)pvStack_220 - (long)pvStack_228 != 0) {
    lVar7 = ((long)pvStack_220 - (long)pvStack_228 >> 3) * -0x5555555555555555;
    uVar6 = lVar7 + (ulong)(lVar7 == 0) + 7 & 0xfffffffffffffff8;
    auVar10 = vpbroadcastq_avx512f();
    auVar20 = ZEXT1664((undefined1  [16])0x0);
    auVar11 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar12 = vpbroadcastq_avx512f(ZEXT816(0x18));
    auVar13 = vpbroadcastq_avx512f(ZEXT816(8));
    do {
      auVar14 = vmovdqa64_avx512f(auVar20);
      uVar8 = vpcmpuq_avx512f(auVar11,auVar10,2);
      vpmullq_avx512dq(auVar11,auVar12);
      auVar20 = vpgatherqq_avx512f(*(undefined8 *)
                                    ((long)&relposeproblem_ptr.
                                            super___shared_ptr<opengv::sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr +
                                    (long)&(pvStack_228->
                                           super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                           super__Vector_impl_data));
      bVar1 = (byte)uVar8;
      auVar15._8_8_ = (ulong)((byte)(uVar8 >> 1) & 1) * auVar20._8_8_;
      auVar15._0_8_ = (ulong)(bVar1 & 1) * auVar20._0_8_;
      auVar15._16_8_ = (ulong)((byte)(uVar8 >> 2) & 1) * auVar20._16_8_;
      auVar15._24_8_ = (ulong)((byte)(uVar8 >> 3) & 1) * auVar20._24_8_;
      auVar15._32_8_ = (ulong)((byte)(uVar8 >> 4) & 1) * auVar20._32_8_;
      auVar15._40_8_ = (ulong)((byte)(uVar8 >> 5) & 1) * auVar20._40_8_;
      auVar15._48_8_ = (ulong)((byte)(uVar8 >> 6) & 1) * auVar20._48_8_;
      auVar15._56_8_ = (uVar8 >> 7) * auVar20._56_8_;
      auVar20 = vpgatherqq_avx512f(*(undefined8 *)
                                    (&stack0xfffffffffffffff8 +
                                    (long)&pvStack_228->
                                           super__Vector_base<int,_std::allocator<int>_>));
      auVar16._8_8_ = (ulong)((byte)(uVar8 >> 1) & 1) * auVar20._8_8_;
      auVar16._0_8_ = (ulong)(bVar1 & 1) * auVar20._0_8_;
      auVar16._16_8_ = (ulong)((byte)(uVar8 >> 2) & 1) * auVar20._16_8_;
      auVar16._24_8_ = (ulong)((byte)(uVar8 >> 3) & 1) * auVar20._24_8_;
      auVar16._32_8_ = (ulong)((byte)(uVar8 >> 4) & 1) * auVar20._32_8_;
      auVar16._40_8_ = (ulong)((byte)(uVar8 >> 5) & 1) * auVar20._40_8_;
      auVar16._48_8_ = (ulong)((byte)(uVar8 >> 6) & 1) * auVar20._48_8_;
      auVar16._56_8_ = (uVar8 >> 7) * auVar20._56_8_;
      auVar20 = vpsubq_avx512f(auVar15,auVar16);
      auVar20 = vpsraq_avx512f(auVar20,2);
      auVar20 = vpaddq_avx512f(auVar20,auVar14);
      auVar11 = vpaddq_avx512f(auVar11,auVar13);
      uVar6 = uVar6 - 8;
    } while (uVar6 != 0);
    auVar10 = vmovdqa64_avx512f(auVar20);
    auVar11._0_8_ = (ulong)(bVar1 & 1) * auVar10._0_8_ | (ulong)!(bool)(bVar1 & 1) * auVar14._0_8_;
    bVar2 = (bool)((byte)(uVar8 >> 1) & 1);
    auVar11._8_8_ = (ulong)bVar2 * auVar10._8_8_ | (ulong)!bVar2 * auVar14._8_8_;
    bVar2 = (bool)((byte)(uVar8 >> 2) & 1);
    auVar11._16_8_ = (ulong)bVar2 * auVar10._16_8_ | (ulong)!bVar2 * auVar14._16_8_;
    bVar2 = (bool)((byte)(uVar8 >> 3) & 1);
    auVar11._24_8_ = (ulong)bVar2 * auVar10._24_8_ | (ulong)!bVar2 * auVar14._24_8_;
    bVar2 = (bool)((byte)(uVar8 >> 4) & 1);
    auVar11._32_8_ = (ulong)bVar2 * auVar10._32_8_ | (ulong)!bVar2 * auVar14._32_8_;
    bVar2 = (bool)((byte)(uVar8 >> 5) & 1);
    auVar11._40_8_ = (ulong)bVar2 * auVar10._40_8_ | (ulong)!bVar2 * auVar14._40_8_;
    bVar2 = (bool)((byte)(uVar8 >> 6) & 1);
    auVar11._48_8_ = (ulong)bVar2 * auVar10._48_8_ | (ulong)!bVar2 * auVar14._48_8_;
    auVar11._56_8_ = (uVar8 >> 7) * auVar10._56_8_ | (ulong)!SUB81(uVar8 >> 7,0) * auVar14._56_8_;
    auVar9 = vextracti64x4_avx512f(auVar11,1);
    auVar10 = vpaddq_avx512f(auVar11,ZEXT3264(auVar9));
    auVar17 = vpaddq_avx(auVar10._0_16_,auVar10._16_16_);
    auVar18 = vpshufd_avx(auVar17,0xee);
    vpaddq_avx(auVar17,auVar18);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"the number of inliers is: ",0x1a);
  std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  plVar4 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"the found inliers are: ",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  if (pvStack_220 != pvStack_228) {
    uVar6 = 0;
    do {
      piVar5 = pvStack_228[uVar6].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pvStack_228[uVar6].super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish != piVar5) {
        uVar8 = 0;
        do {
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,piVar5[uVar8]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
          uVar8 = uVar8 + 1;
          piVar5 = pvStack_228[uVar6].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        } while (uVar8 < (ulong)((long)pvStack_228[uVar6].
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish - (long)piVar5 >> 2));
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)(((long)pvStack_220 - (long)pvStack_228 >> 3) * -0x5555555555555555));
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  plVar4 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  if (local_438._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_438._M_pi);
  }
  opengv::sac::
  MultiSampleConsensus<opengv::sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem>::
  ~MultiSampleConsensus
            ((MultiSampleConsensus<opengv::sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem>
              *)local_2c0);
  opengv::relative_pose::NoncentralRelativeMultiAdapter::~NoncentralRelativeMultiAdapter(&local_148)
  ;
  std::
  vector<std::shared_ptr<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_std::allocator<std::shared_ptr<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
  ::~vector(&local_350);
  std::
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ::~vector(&local_3e0);
  std::
  vector<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_std::allocator<std::shared_ptr<std::vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>_>
  ::~vector(&local_3c0);
  if (local_430.
      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free((void *)local_430.
                 super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1].
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                 [8]);
  }
  if (local_410.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free((void *)local_410.
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1].
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                 [2]);
  }
  return 0;
}

Assistant:

int main( int argc, char** argv )
{
  // initialize random seed
  initializeRandomSeed();

  //set experiment parameters
  double noise = 0.3;
  double outlierFraction = 0.1;
  size_t pointsPerCam = 25;
  int numberCameras = 4;

  //generate a random pose for viewpoint 1
  translation_t position1 = Eigen::Vector3d::Zero();
  rotation_t rotation1 = Eigen::Matrix3d::Identity();

  //generate a random pose for viewpoint 2
  translation_t position2 = generateRandomTranslation(2.0);
  rotation_t rotation2 = generateRandomRotation(0.5);

  //create a fake central camera
  translations_t camOffsets;
  rotations_t camRotations;
  generateRandomCameraSystem( numberCameras, camOffsets, camRotations );

  //derive correspondences based on random point-cloud
  std::vector<std::shared_ptr<bearingVectors_t> > multiBearingVectors1;
  std::vector<std::shared_ptr<bearingVectors_t> > multiBearingVectors2;
  std::vector<std::shared_ptr<Eigen::MatrixXd> > gt;
  generateMulti2D2DCorrespondences(
      position1, rotation1, position2, rotation2, camOffsets, camRotations,
      pointsPerCam, noise, outlierFraction,
      multiBearingVectors1, multiBearingVectors2, gt );

  //Extract the relative pose
  translation_t position; rotation_t rotation;
  extractRelativePose(
      position1, position2, rotation1, rotation2, position, rotation, false );

  //print experiment characteristics
  printExperimentCharacteristics( position, rotation, noise, outlierFraction );
  
  //create a non-central relative multi-adapter
  relative_pose::NoncentralRelativeMultiAdapter adapter(
      multiBearingVectors1,
      multiBearingVectors2,
      camOffsets,
      camRotations);

  //Create a MultiNoncentralRelativePoseSacProblem and Ransac
  opengv::sac::MultiRansac<
      sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem> ransac;
  std::shared_ptr<
      sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem> relposeproblem_ptr(
      new sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem(
      adapter,
      sac_problems::relative_pose::MultiNoncentralRelativePoseSacProblem::SIXPT));
  ransac.sac_model_ = relposeproblem_ptr;
  ransac.threshold_ = 2.0*(1.0 - cos(atan(sqrt(2.0)*0.5/800.0)));
  ransac.max_iterations_ = 100;

  //Run the experiment
  struct timeval tic;
  struct timeval toc;
  gettimeofday( &tic, 0 );
  ransac.computeModel();
  gettimeofday( &toc, 0 );
  double ransac_time = TIMETODOUBLE(timeval_minus(toc,tic));

  //print the results
  std::cout << "the ransac threshold is: " << ransac.threshold_ << std::endl;
  std::cout << "the ransac results is: " << std::endl;
  std::cout << ransac.model_coefficients_ << std::endl << std::endl;
  std::cout << "Ransac needed " << ransac.iterations_ << " iterations and ";
  std::cout << ransac_time << " seconds" << std::endl << std::endl;
  size_t numberInliers = 0;
  for(size_t i = 0; i < ransac.inliers_.size(); i++)
    numberInliers += ransac.inliers_[i].size();
  std::cout << "the number of inliers is: " << numberInliers;
  std::cout << std::endl << std::endl;
  std::cout << "the found inliers are: " << std::endl;
  for(size_t i = 0; i < ransac.inliers_.size(); i++)
  {
    for(size_t j = 0; j < ransac.inliers_[i].size(); j++)
      std::cout << ransac.inliers_[i][j] << " ";
  }
  std::cout << std::endl << std::endl;
}